

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logger::Impl::Impl(Impl *this,char *fileName,int line)

{
  allocator<char> local_19;
  
  memset(this,0,0xfa8);
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  this->line_ = line;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->basename_,fileName,&local_19);
  formatTime(this);
  return;
}

Assistant:

Logger::Impl::Impl(const char* fileName, int line)
        : stream_(),
        line_(line),
        basename_(fileName){
            formatTime();            
}